

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol4f
          (X3DImporter *this,int pAttrIdx,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pValue)

{
  size_t sVar1;
  bool bVar2;
  size_type __n;
  reference __x;
  _Self local_58;
  _Self local_50;
  iterator it;
  undefined1 local_38 [8];
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tlist;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  tlist.super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl._M_node.
  _M_size = (size_t)pValue;
  std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::list
            ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
  XML_ReadNode_GetAttrVal_AsListCol4f
            (this,pAttrIdx,(list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
  bVar2 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty
                    ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
  sVar1 = tlist.super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
          _M_node._M_size;
  if (!bVar2) {
    __n = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                    ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)sVar1,__n);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin
                   ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
    while( true ) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end
                     ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
      bVar2 = std::operator!=(&local_50,&local_58);
      sVar1 = tlist.super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              _M_node._M_size;
      if (!bVar2) break;
      __x = std::_List_iterator<aiColor4t<float>_>::operator*(&local_50);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)sVar1,__x);
      std::_List_iterator<aiColor4t<float>_>::operator++(&local_50);
    }
  }
  std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~list
            ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_38);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol4f(const int pAttrIdx, std::vector<aiColor4D>& pValue)
{
    std::list<aiColor4D> tlist;

	XML_ReadNode_GetAttrVal_AsListCol4f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
        for ( std::list<aiColor4D>::iterator it = tlist.begin(); it != tlist.end(); ++it )
        {
            pValue.push_back( *it );
        }
	}
}